

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_serpent.cpp
# Opt level: O3

int AF_A_SerpentMeleeAttack
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  FString *this;
  VMValue *pVVar8;
  AActor *pAVar9;
  char *__assertion;
  AActor *this_00;
  long lVar10;
  bool bVar11;
  bool bVar12;
  VMValue params [3];
  FSoundID local_78;
  FName local_74;
  DAngle local_70;
  anon_union_16_5_cf148060_for_VMValue_0 local_68;
  AActor *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  FString local_48;
  undefined4 local_40;
  char local_3c [12];
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e987a;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005e986a;
  this_00 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_00 == (AActor *)0x0) goto LAB_005e961a;
    pPVar7 = (this_00->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar4 = (**(this_00->super_DThinker).super_DObject._vptr_DObject)(this_00);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar4);
      (this_00->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar11 = pPVar7 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar11;
    bVar12 = pPVar7 == pPVar3;
    if (!bVar12 && !bVar11) {
      do {
        pPVar7 = pPVar7->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
        if (pPVar7 == pPVar3) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    pVVar8 = (VMValue *)(ulong)(bVar12 || bVar11);
    uVar5 = (uint)bVar11;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005e987a;
    }
  }
  else {
    if (this_00 != (AActor *)0x0) goto LAB_005e986a;
LAB_005e961a:
    this_00 = (AActor *)0x0;
    pVVar8 = param;
    uVar5 = numparam;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005e986a:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005e987a;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar7 = (PClass *)puVar2[1];
          if (pPVar7 == (PClass *)0x0) {
            pPVar7 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar5,ret);
            puVar2[1] = pPVar7;
          }
          bVar11 = pPVar7 != (PClass *)0x0;
          if (pPVar7 != pPVar3 && bVar11) {
            do {
              pPVar7 = pPVar7->ParentClass;
              bVar11 = pPVar7 != (PClass *)0x0;
              if (pPVar7 == pPVar3) break;
            } while (pPVar7 != (PClass *)0x0);
          }
          if (!bVar11) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005e987a;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_005e986a;
    }
    if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005e987a:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                    ,0xbf,
                    "int AF_A_SerpentMeleeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  pAVar9 = (this_00->target).field_0.p;
  if (pAVar9 == (AActor *)0x0) {
    return 0;
  }
  if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this_00->target).field_0.p = (AActor *)0x0;
    return 0;
  }
  bVar11 = AActor::CheckMeleeRange(this_00);
  if (!bVar11) goto LAB_005e97c5;
  uVar5 = FRandom::GenRand32(&pr_serpentmeattack);
  iVar4 = (uVar5 & 7) * 5 + 5;
  pAVar9 = (this_00->target).field_0.p;
  if (pAVar9 == (AActor *)0x0) {
LAB_005e973e:
    pAVar9 = (AActor *)0x0;
  }
  else if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this_00->target).field_0.p = (AActor *)0x0;
    goto LAB_005e973e;
  }
  local_74.Index = 0x84;
  local_70.Degrees = 0.0;
  iVar6 = P_DamageMobj(pAVar9,this_00,this_00,iVar4,&local_74,0,&local_70);
  if (0 < iVar6) {
    iVar4 = iVar6;
  }
  pAVar9 = (this_00->target).field_0.p;
  if (pAVar9 == (AActor *)0x0) {
LAB_005e978e:
    pAVar9 = (AActor *)0x0;
  }
  else if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this_00->target).field_0.p = (AActor *)0x0;
    goto LAB_005e978e;
  }
  P_TraceBleed(iVar4,pAVar9,this_00);
  local_78.ID = S_FindSound("SerpentMeleeHit");
  S_Sound(this_00,4,&local_78,1.0,1.0);
LAB_005e97c5:
  uVar5 = FRandom::GenRand32(&pr_serpentmeattack);
  if ((uVar5 & 0xe0) < 0x60) {
    local_68.field_1.atag = 1;
    local_68.field_3.Type = '\x03';
    local_50 = 1;
    local_4c = 3;
    local_48.Chars = (char *)0x0;
    local_40 = 8;
    local_3c[0] = 3;
    local_68.field_1.a = this_00;
    local_58 = this_00;
    VMFrameStack::Call(stack,&A_SerpentCheckForAttack_VMPtr->super_VMFunction,
                       (VMValue *)&local_68.field_1,3,(VMReturn *)0x0,0,(VMException **)0x0);
    lVar10 = -0x30;
    this = &local_48;
    do {
      if (*(char *)((long)&this[1].Chars + 4) == '\x02') {
        FString::~FString(this);
      }
      this = this + -2;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SerpentMeleeAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
	{
		return 0;
	}
	if (self->CheckMeleeRange ())
	{
		int damage = pr_serpentmeattack.HitDice (5);
		int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
		S_Sound (self, CHAN_BODY, "SerpentMeleeHit", 1, ATTN_NORM);
	}
	if (pr_serpentmeattack() < 96)
	{
		CALL_ACTION(A_SerpentCheckForAttack, self);
	}
	return 0;
}